

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

void compile_matchingpath
               (compiler_common *common,PCRE2_SPTR16 cc,PCRE2_SPTR16 ccend,backtrack_common *parent)

{
  jump_list **ppjVar1;
  sljit_u8 sVar2;
  byte bVar3;
  ushort uVar4;
  sljit_compiler *compiler;
  sljit_compiler *psVar5;
  sljit_compiler *psVar6;
  recurse_entry *prVar7;
  ushort uVar8;
  bool bVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  jump_list *list_item;
  then_trap_backtrack *ptVar14;
  sljit_u8 *psVar15;
  sljit_jump *psVar16;
  stub_list *psVar17;
  backtrack_common *pbVar18;
  long lVar19;
  long immb;
  long *plVar20;
  sljit_label *psVar21;
  assert_backtrack *backtrack;
  jump_list *pjVar22;
  recurse_entry *prVar23;
  sljit_jump *psVar24;
  sljit_jump *psVar25;
  sljit_jump *psVar26;
  jump_list *pjVar27;
  PCRE2_SPTR16 pPVar28;
  sljit_jump *psVar29;
  backtrack_common *pbVar30;
  sljit_label *psVar31;
  BOOL BVar32;
  ulong uVar33;
  sljit_sw offset;
  jump_list **ppjVar34;
  sljit_u32 extraout_EDX;
  sljit_u32 extraout_EDX_00;
  sljit_u32 sVar35;
  ushort uVar36;
  int iVar37;
  ulong srcw;
  sljit_u32 sVar38;
  PCRE2_SPTR16 pPVar39;
  compiler_common *cc_00;
  sljit_s32 sVar40;
  int iVar41;
  undefined1 *srcw_00;
  sljit_sw sVar42;
  long lVar43;
  ulong uVar44;
  short *psVar45;
  long *plVar46;
  compiler_common *common_00;
  recurse_entry *prVar47;
  sljit_s32 sVar48;
  bool bVar49;
  int iVar50;
  backtrack_common *local_108;
  sljit_sw local_d8;
  ulong local_b0;
  then_trap_backtrack *local_90;
  BOOL needs_control_head;
  int local_78;
  int iStack_74;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  sljit_sw local_48;
  recurse_entry *local_40;
  long local_38;
  
  compiler = common->compiler;
  if ((common->has_then == 0) || (common->then_offsets[(long)cc - (long)common->start >> 1] == '\0')
     ) {
    bVar9 = true;
    local_90 = (then_trap_backtrack *)0x0;
  }
  else {
    local_90 = common->then_trap;
    if ((compiler->error == 0) &&
       (ptVar14 = (then_trap_backtrack *)ensure_abuf(compiler,0x48), compiler->error == 0)) {
      ptVar14->start = 0;
      ptVar14->quit = (jump_list *)0x0;
      (ptVar14->common).cc = (PCRE2_SPTR16)0x0;
      ptVar14->then_trap = (then_trap_backtrack *)0x0;
      (ptVar14->common).top = (backtrack_common *)0x0;
      (ptVar14->common).topbacktracks = (jump_list *)0x0;
      *(undefined8 *)&ptVar14->framesize = 0;
      (ptVar14->common).prev = (backtrack_common *)0x0;
      (ptVar14->common).nextbacktracks = (jump_list *)0x0;
      (ptVar14->common).prev = parent->top;
      parent->top = (backtrack_common *)ptVar14;
      common->then_trap = ptVar14;
      (ptVar14->common).cc = then_trap_opcode;
      ptVar14->start = (long)cc - (long)common->start >> 1;
      local_108 = (backtrack_common *)0x0;
      uVar11 = get_framesize(common,cc,ccend,0,&needs_control_head);
      if (0 < (int)uVar11) {
        local_108 = (backtrack_common *)(ulong)uVar11;
      }
      ptVar14->framesize = uVar11;
      iVar12 = (int)local_108;
      if (compiler->error == 0) {
        iVar13 = common->control_head_ptr;
        compiler->mode32 = 0;
        psVar15 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar13);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x8b;
        }
      }
      psVar5 = common->compiler;
      sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,(ulong)(iVar12 + 3) << 3);
      iVar13 = 0xb;
      psVar16 = sljit_emit_cmp(psVar5,2,0xc,0,0xb,0);
      psVar5 = common->compiler;
      if ((psVar5->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar5,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar5);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      if ((int)uVar11 < 1) {
        if (compiler->error == 0) {
          iVar37 = common->control_head_ptr;
          compiler->mode32 = 0;
          iVar13 = 0x8e;
          psVar15 = emit_x86_instruction(compiler,1,0xc,0,0x8e,(long)iVar37);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
          goto LAB_0010abc7;
        }
      }
      else {
        iVar13 = 0xc;
        sljit_emit_op2(compiler,0x60,0x8e,(long)common->control_head_ptr,0xc,0,0x40,
                       (long)local_108 << 3);
LAB_0010abc7:
        if (compiler->error == 0) {
          sVar42 = ptVar14->start;
          compiler->mode32 = 0;
          emit_mov(compiler,0x8c,(ulong)(iVar12 * 8 + 0x10),0x40,sVar42);
          iVar13 = (int)sVar42;
          if (compiler->error == 0) {
            compiler->mode32 = 0;
            iVar13 = 0x8c;
            psVar15 = emit_x86_instruction(compiler,1,0x40,1,0x8c,(long)(int)(iVar12 * 8 + 8));
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 199;
            }
            if (compiler->error == 0) {
              compiler->mode32 = 0;
              iVar13 = 0x8c;
              psVar15 = emit_x86_instruction(compiler,1,4,0,0x8c,(ulong)(uint)(iVar12 * 8));
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x89;
              }
            }
          }
        }
      }
      if (-1 < ptVar14->framesize) {
        init_frame(common,cc,ccend,ptVar14->framesize + -1,iVar13);
      }
    }
    bVar9 = false;
  }
  local_40 = (recurse_entry *)&common->entries;
  ppjVar1 = &parent->topbacktracks;
LAB_0010aca2:
  if (ccend <= cc) {
    if (bVar9) {
      return;
    }
    if (compiler->error != 0) {
      return;
    }
    pbVar30 = (backtrack_common *)ensure_abuf(compiler,0x48);
    if (compiler->error != 0) {
      return;
    }
    pbVar30[1].nextbacktracks = (jump_list *)0x0;
    pbVar30[1].top = (backtrack_common *)0x0;
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30[1].prev = (backtrack_common *)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30[1].topbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    parent->top = pbVar30;
    pbVar30->cc = then_trap_opcode;
    pbVar30[1].prev = &common->then_trap->common;
    common->then_trap = local_90;
    return;
  }
  uVar36 = *(ushort *)&((backtrack_common *)cc)->prev;
  if (0xa2 < uVar36 - 1) {
    return;
  }
  switch((uint)uVar36) {
  case 1:
  case 2:
  case 4:
  case 5:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x7d:
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 2);
    ppjVar34 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar34 = ppjVar1;
    }
    bVar49 = false;
LAB_0010aceb:
    psVar5 = common->compiler;
    switch(uVar36) {
    case 0x17:
      goto switchD_0010ad14_caseD_17;
    case 0x18:
      psVar16 = sljit_emit_cmp(psVar5,2,2,0,0xd,0);
      iVar12 = psVar5->error;
joined_r0x0010e97e:
      if ((iVar12 == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar16;
        *ppjVar34 = pjVar22;
      }
      goto LAB_0010e772;
    case 0x19:
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,4,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0x100;
          psVar15 = emit_x86_instruction(psVar5,1,0x40,2,0x84,0x58);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0xf7;
          }
        }
      }
      psVar16 = sljit_emit_jump(psVar5,0x101);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar16;
        *ppjVar34 = pjVar22;
      }
      if (common->endonly != 0) {
        psVar16 = sljit_emit_cmp(psVar5,2,2,0,0xd,0);
        iVar12 = psVar5->error;
        goto joined_r0x0010e97e;
      }
      if (!bVar49) {
        local_108 = pbVar30;
      }
      bVar49 = true;
      uVar36 = 0x17;
      goto LAB_0010aceb;
    case 0x1a:
      psVar16 = sljit_emit_cmp(psVar5,2,2,0,0xd,0);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,4,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0x100;
          psVar15 = emit_x86_instruction(psVar5,1,0x40,2,0x84,0x58);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0xf7;
          }
        }
      }
      psVar24 = sljit_emit_jump(psVar5,0x101);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      check_partial(common,0);
      sVar38 = 0x18;
      psVar24 = sljit_emit_jump(psVar5,0x18);
      psVar31 = sljit_emit_label(psVar5);
      if ((psVar16 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
        psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
        (psVar16->u).label = psVar31;
      }
      if ((common->nltype != 0) || (common->newline < 0x100)) {
        peek_char((compiler_common *)common->compiler,sVar38);
        goto LAB_0010d9cb;
      }
      sljit_emit_op2(psVar5,0x60,4,0,2,0,0x40,4);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          psVar15[0] = '\x0f';
          psVar15[1] = 0xb7;
        }
      }
      if (common->mode == 1) {
        psVar16 = sljit_emit_cmp(psVar5,4,4,0,0xd,0);
        if (psVar5->error != 0) goto LAB_0010e889;
        pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
        if (pjVar22 != (jump_list *)0x0) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar16;
          *ppjVar34 = pjVar22;
        }
      }
      else {
        psVar16 = sljit_emit_cmp(psVar5,5,4,0,0xd,0);
        psVar29 = sljit_emit_cmp(psVar5,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar29;
          *ppjVar34 = pjVar22;
        }
        check_partial(common,1);
        psVar29 = sljit_emit_jump(psVar5,0x18);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar29;
          *ppjVar34 = pjVar22;
        }
        psVar31 = sljit_emit_label(psVar5);
        if ((psVar16 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
          psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
          (psVar16->u).label = psVar31;
        }
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        sVar42 = 2;
LAB_0010e878:
        psVar15 = emit_x86_instruction(psVar5,2,4,0,0x82,sVar42);
        if (psVar15 != (sljit_u8 *)0x0) {
          psVar15[0] = '\x0f';
          psVar15[1] = 0xb7;
        }
      }
LAB_0010e889:
      psVar16 = sljit_emit_cmp(psVar5,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar16;
        *ppjVar34 = pjVar22;
      }
      psVar16 = sljit_emit_cmp(psVar5,1,4,0,0x40,(ulong)(byte)common->newline);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar16;
        *ppjVar34 = pjVar22;
      }
      break;
    case 0x1b:
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,4,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,1,0,0x84,0x10);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
        }
      }
      psVar16 = sljit_emit_cmp(psVar5,4,2,0,1,0);
      if (psVar5->error == 0) {
        pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
        if (pjVar22 != (jump_list *)0x0) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar16;
          *ppjVar34 = pjVar22;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0x100;
          psVar15 = emit_x86_instruction(psVar5,1,0x40,1,0x84,0x58);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0xf7;
          }
        }
      }
      uVar11 = 0x101;
      goto LAB_0010d39f;
    case 0x1c:
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,4,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,1,0,0x84,0x10);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
        }
      }
      psVar16 = sljit_emit_cmp(psVar5,4,2,0,1,0);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0x100;
        psVar15 = emit_x86_instruction(psVar5,1,0x40,1,0x84,0x58);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0xf7;
        }
      }
      psVar24 = sljit_emit_jump(psVar5,0x101);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      psVar24 = sljit_emit_jump(psVar5,0x18);
      psVar31 = sljit_emit_label(psVar5);
      if ((psVar16 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
        psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
        (psVar16->u).label = psVar31;
      }
      if (((common->alt_circumflex == 0) &&
          (psVar16 = sljit_emit_cmp(psVar5,3,2,0,0xd,0), psVar5->error == 0)) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar16;
        *ppjVar34 = pjVar22;
      }
      if ((common->nltype == 0) && (0xff < common->newline)) {
        sljit_emit_op2(psVar5,0x62,4,0,2,0,0x40,4);
        psVar16 = sljit_emit_cmp(psVar5,2,4,0,1,0);
        if (psVar5->error == 0) {
          pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
          if (pjVar22 != (jump_list *)0x0) {
            pjVar22->next = *ppjVar34;
            pjVar22->jump = psVar16;
            *ppjVar34 = pjVar22;
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,-4);
            if (psVar15 != (sljit_u8 *)0x0) {
              psVar15[0] = '\x0f';
              psVar15[1] = 0xb7;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              sVar42 = -2;
              goto LAB_0010e878;
            }
          }
        }
        goto LAB_0010e889;
      }
      sVar35 = 2;
      BVar32 = 0x40;
      sVar38 = 0x62;
      sljit_emit_op2(common->compiler,0x62,2,0,2,0,0x40,2);
      read_char_range((compiler_common *)common->compiler,sVar38,sVar35,BVar32);
LAB_0010d9cb:
      check_newlinechar(common,common->nltype,ppjVar34,0);
      break;
    default:
      if (uVar36 == 0x7d) {
        uVar36 = *(ushort *)&pbVar30->prev;
        if (uVar36 == 0) {
          pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 4);
        }
        else {
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              psVar15 = emit_x86_instruction(psVar5,1,1,0,0x81,0x10);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x8b;
              }
            }
          }
          sljit_emit_op2(psVar5,0x62,2,0,2,0,0x40,(ulong)((uint)uVar36 * 2));
          psVar16 = sljit_emit_cmp(psVar5,2,2,0,1,0);
          if ((psVar5->error == 0) &&
             (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
            pjVar22->next = *ppjVar34;
            pjVar22->jump = psVar16;
            *ppjVar34 = pjVar22;
          }
          check_start_used_ptr(common);
          pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 4);
        }
        goto LAB_0010b0bc;
      }
      if (uVar36 - 4 < 2) {
        psVar16 = sljit_emit_jump(psVar5,0x19);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = common->wordboundary;
          pjVar22->jump = psVar16;
          common->wordboundary = pjVar22;
        }
        uVar11 = (uint)(uVar36 == 4);
LAB_0010d39f:
        psVar16 = sljit_emit_jump(psVar5,uVar11);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar16;
          *ppjVar34 = pjVar22;
        }
      }
      else {
        if (uVar36 == 2) {
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              sVar42 = 8;
              goto LAB_0010d6b7;
            }
          }
        }
        else {
          if (uVar36 != 1) goto LAB_0010b0bc;
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              sVar42 = 0x10;
LAB_0010d6b7:
              psVar15 = emit_x86_instruction(psVar5,1,1,0,0x81,sVar42);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x8b;
              }
            }
          }
        }
        psVar16 = sljit_emit_cmp(psVar5,1,2,0,1,0);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar16;
          *ppjVar34 = pjVar22;
        }
      }
      goto LAB_0010b0bc;
    }
    psVar31 = sljit_emit_label(psVar5);
    if ((psVar24 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
      psVar24->flags = (psVar24->flags & 0xfffffffffffffffcU) + 1;
      (psVar24->u).label = psVar31;
    }
    goto LAB_0010b0bc;
  case 3:
    if (compiler->error != 0) {
      return;
    }
    pbVar30 = (backtrack_common *)ensure_abuf(compiler,0x28);
    if (compiler->error != 0) {
      return;
    }
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    if (compiler->error == 0) {
      iVar12 = common->ovector_start;
      compiler->mode32 = 0;
      psVar15 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar12);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
    }
    psVar5 = common->compiler;
    sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,8);
    psVar16 = sljit_emit_cmp(psVar5,2,0xc,0,0xb,0);
    psVar5 = common->compiler;
    if ((psVar5->error == 0) &&
       (psVar17 = (stub_list *)ensure_abuf(psVar5,0x18), psVar17 != (stub_list *)0x0)) {
      psVar17->start = psVar16;
      psVar31 = sljit_emit_label(psVar5);
      psVar17->quit = psVar31;
      psVar17->next = common->stubs;
      common->stubs = psVar17;
    }
    if (compiler->error == 0) {
      iVar12 = common->ovector_start;
      compiler->mode32 = 0;
      psVar15 = emit_x86_instruction(compiler,1,2,0,0x8e,(long)iVar12);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x89;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar15 = emit_x86_instruction(compiler,1,4,0,0x8c,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
    goto LAB_0010cb16;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x1f:
  case 0x20:
    goto switchD_0010acd2_caseD_6;
  case 0x1d:
  case 0x1e:
    if (common->mode == 1) {
      ppjVar34 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar34 = ppjVar1;
      }
      psVar5 = common->compiler;
      needs_control_head = 0;
      pbVar30 = (backtrack_common *)cc;
      while (pbVar30 < ccend) {
        bVar49 = true;
        if (*(short *)&pbVar30->prev == 0x1d) {
LAB_0010ddeb:
          uVar11 = 1;
        }
        else {
          if (*(short *)&pbVar30->prev != 0x1e) break;
          uVar4 = *(ushort *)((long)&pbVar30->prev + 2);
          if (0xff < (ulong)uVar4) goto LAB_0010ddeb;
          uVar11 = 1;
          if (uVar4 != common->fcc[uVar4]) {
            uVar8 = common->fcc[uVar4] ^ uVar4;
            if ((0x7f < uVar4) || (uVar8 != 0x20)) {
              bVar49 = (uVar8 & uVar8 - 1) == 0;
            }
            uVar11 = (uint)bVar49;
          }
        }
        needs_control_head = needs_control_head + uVar11 * 2;
        if ((bVar49 == false) ||
           (pbVar30 = (backtrack_common *)((long)&pbVar30->prev + (ulong)(uVar11 * 2) + 2),
           0x80 < (uint)needs_control_head)) break;
      }
      if (needs_control_head < 1) {
        pbVar30 = (backtrack_common *)
                  compile_char1_matchingpath
                            (common,uVar36,(PCRE2_SPTR16)((long)&((backtrack_common *)cc)->prev + 2)
                             ,ppjVar34,1);
      }
      else {
        sljit_emit_op2(psVar5,0x60,2,0,2,0,0x40,(ulong)(uint)needs_control_head);
        psVar16 = sljit_emit_cmp(psVar5,4,2,0,0xd,0);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar16;
          *ppjVar34 = pjVar22;
        }
        local_78 = -1;
        iStack_74 = 0;
        do {
          cc = byte_sequence_compare
                         (common,(uint)(*(short *)&((backtrack_common *)cc)->prev == 0x1e),
                          (PCRE2_SPTR16)((long)&((backtrack_common *)cc)->prev + 2),
                          (compare_context *)&needs_control_head,ppjVar34);
          pbVar30 = (backtrack_common *)cc;
        } while (0 < needs_control_head);
      }
      break;
    }
    ppjVar34 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar34 = ppjVar1;
    }
    goto LAB_0010dcff;
  default:
    goto switchD_0010acd2_caseD_21;
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
    goto switchD_0010acd2_caseD_62;
  case 0x6e:
  case 0x6f:
    if ((ushort)(*(short *)((long)&((backtrack_common *)cc)->cc + 2) - 0x62U) < 0xc)
    goto switchD_0010acd2_caseD_21;
    goto switchD_0010acd2_caseD_6;
  case 0x70:
    if (0xb < (ushort)(*(short *)((long)&((backtrack_common *)cc)->prev +
                                 (ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 2) * 2)
                      - 0x62U)) {
      ppjVar34 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar34 = ppjVar1;
      }
      uVar36 = 0x70;
      goto LAB_0010dcff;
    }
    goto switchD_0010acd2_caseD_21;
  case 0x71:
  case 0x72:
    if (0xb < (ushort)(*(short *)((long)&((backtrack_common *)cc)->prev + 4) - 0x62U)) {
      pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 4);
      ppjVar34 = &parent->top->nextbacktracks;
      if (parent->top == (backtrack_common *)0x0) {
        ppjVar34 = ppjVar1;
      }
      goto LAB_0010e45e;
    }
LAB_0010dece:
    pbVar30 = (backtrack_common *)compile_ref_iterator_matchingpath(common,cc,parent);
    break;
  case 0x73:
  case 0x74:
    if ((ushort)(*(short *)((long)&((backtrack_common *)cc)->prev + 6) - 0x62U) < 0xc)
    goto LAB_0010dece;
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 6);
    compile_dnref_search
              (common,(PCRE2_SPTR16)(ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 2),
               (jump_list **)(ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 4));
    ppjVar34 = &parent->top->nextbacktracks;
    if (parent->top == (backtrack_common *)0x0) {
      ppjVar34 = ppjVar1;
    }
LAB_0010e45e:
    compile_ref_matchingpath(common,cc,ppjVar34,1,0);
    break;
  case 0x75:
    psVar5 = common->compiler;
    if (psVar5->error == 0) {
      prVar7 = common->entries;
      uVar36 = *(ushort *)((long)&((backtrack_common *)cc)->prev + 2);
      pbVar30 = (backtrack_common *)ensure_abuf(psVar5,0x40);
      pbVar18 = local_108;
      if (psVar5->error == 0) {
        pbVar30[1].nextbacktracks = (jump_list *)0x0;
        pbVar30[1].top = (backtrack_common *)0x0;
        pbVar30->cc = (PCRE2_SPTR16)0x0;
        pbVar30[1].prev = (backtrack_common *)0x0;
        pbVar30->top = (backtrack_common *)0x0;
        pbVar30->topbacktracks = (jump_list *)0x0;
        pbVar30->prev = (backtrack_common *)0x0;
        pbVar30->nextbacktracks = (jump_list *)0x0;
        pbVar30->prev = parent->top;
        pbVar30->cc = cc;
        parent->top = pbVar30;
        common_00 = (compiler_common *)((ulong)((uint)uVar36 * 2) + (long)common->start);
        cc_00 = common_00;
        iVar12 = get_framesize(common,(PCRE2_SPTR16)common_00,(PCRE2_SPTR16)0x0,1,
                               &needs_control_head);
        local_108 = pbVar30;
        if (iVar12 == -2) {
          pPVar28 = next_opcode(common_00,(PCRE2_SPTR16)cc_00);
          do {
            common_00 = (compiler_common *)
                        ((long)&common_00->compiler +
                        (ulong)*(PCRE2_SPTR16)((long)&common_00->compiler + 2) * 2);
          } while (*(PCRE2_UCHAR16 *)&common_00->compiler == 0x78);
          compile_matchingpath(common,pPVar28,(PCRE2_SPTR16)common_00,pbVar30);
          *(undefined4 *)&pbVar30[1].top = 1;
          goto LAB_0010e4aa;
        }
        if (prVar7 == (recurse_entry *)0x0) {
          prVar47 = (recurse_entry *)0x0;
        }
        else {
          do {
            prVar23 = prVar7;
            if (prVar23->start == (ulong)uVar36) {
              psVar31 = prVar23->entry_label;
              pbVar30[1].nextbacktracks = (jump_list *)prVar23;
              if (psVar31 == (sljit_label *)0x0) goto LAB_0010d14f;
              psVar16 = sljit_emit_jump(psVar5,0x19);
              if ((psVar16 != (sljit_jump *)0x0) &&
                 (psVar31 = prVar23->entry_label, psVar31 != (sljit_label *)0x0)) {
                psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
                (psVar16->u).target = (sljit_uw)psVar31;
              }
              goto LAB_0010d188;
            }
            prVar7 = prVar23->next;
            prVar47 = prVar23;
          } while (prVar23->next != (recurse_entry *)0x0);
        }
        pbVar18 = pbVar30;
        if ((psVar5->error == 0) &&
           (prVar23 = (recurse_entry *)ensure_abuf(psVar5,0x30), psVar5->error == 0)) {
          prVar23->backtrack_label = (sljit_label *)0x0;
          ((anon_union_8_2_cb96b71c_for_u *)&prVar23->entry_calls)->target = 0;
          prVar23->backtrack_calls = (jump_list *)0x0;
          prVar23->next = (recurse_entry *)0x0;
          prVar23->entry_label = (sljit_label *)0x0;
          if (prVar47 == (recurse_entry *)0x0) {
            prVar47 = local_40;
          }
          prVar23->start = (ulong)uVar36;
          prVar47->next = prVar23;
          pbVar30[1].nextbacktracks = (jump_list *)prVar23;
LAB_0010d14f:
          psVar16 = sljit_emit_jump(psVar5,0x19);
          if ((psVar5->error == 0) &&
             (psVar31 = (sljit_label *)ensure_abuf(psVar5,0x10), psVar31 != (sljit_label *)0x0)) {
            psVar31->addr = (sljit_uw)*(anon_union_8_2_cb96b71c_for_u *)&prVar23->entry_calls;
            psVar31->next = (sljit_label *)psVar16;
            ((anon_union_8_2_cb96b71c_for_u *)&prVar23->entry_calls)->label = psVar31;
          }
LAB_0010d188:
          psVar16 = sljit_emit_cmp(psVar5,0,1,0,0x40,0);
          if ((psVar5->error == 0) &&
             (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
            pjVar22->next = pbVar30->topbacktracks;
            pjVar22->jump = psVar16;
            pbVar30->topbacktracks = pjVar22;
          }
          pbVar18 = (backtrack_common *)sljit_emit_label(psVar5);
          pbVar30[1].prev = pbVar18;
          goto LAB_0010d1d3;
        }
      }
LAB_0010df6e:
      local_108 = pbVar18;
      pbVar30 = (backtrack_common *)0x0;
    }
    else {
LAB_0010ead9:
      pbVar30 = (backtrack_common *)0x0;
    }
    break;
  case 0x76:
  case 0x77:
    if (uVar36 == 0x76) {
      local_108 = (backtrack_common *)0x4;
    }
    else {
      local_108 = (backtrack_common *)(ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 6);
    }
    psVar5 = common->compiler;
    if (psVar5->error != 0) {
      return;
    }
    uVar36 = common->re->top_bracket;
    pbVar30 = (backtrack_common *)ensure_abuf(psVar5,0x28);
    if (psVar5->error != 0) {
      return;
    }
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    uVar44 = (ulong)((uint)uVar36 * 0x10 + 0x80);
    psVar6 = common->compiler;
    sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,uVar44);
    psVar16 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
    psVar6 = common->compiler;
    if ((psVar6->error == 0) &&
       (psVar17 = (stub_list *)ensure_abuf(psVar6,0x18), psVar17 != (stub_list *)0x0)) {
      psVar17->start = psVar16;
      psVar31 = sljit_emit_label(psVar6);
      psVar17->quit = psVar31;
      psVar17->next = common->stubs;
      common->stubs = psVar17;
    }
    if (psVar5->error == 0) {
      iVar12 = common->capture_last_ptr;
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar12);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
    if (*(short *)&((backtrack_common *)cc)->prev == 0x76) {
      uVar33 = (ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 6);
    }
    else {
      uVar33 = 0;
    }
    iVar12 = psVar5->error;
    if (iVar12 == 0) {
      psVar5->mode32 = 1;
      psVar15 = emit_x86_instruction(psVar5,1,0x40,uVar33,0x8c,4);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 199;
        psVar5->mode32 = 0;
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 1;
        psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8c,0xc);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
          psVar5->mode32 = 0;
        }
        if (psVar5->error == 0) {
          uVar36 = common->re->top_bracket;
          psVar5->mode32 = 1;
          psVar15 = emit_x86_instruction(psVar5,1,0x40,(ulong)uVar36 + 1,0x8c,8);
          if (psVar15 == (sljit_u8 *)0x0) {
            if (psVar5->error != 0) goto LAB_0010cc16;
          }
          else {
            *psVar15 = 199;
            psVar5->mode32 = 0;
            iVar12 = psVar5->error;
            if (iVar12 != 0) goto LAB_0010cc19;
          }
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8c,0x10);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
        }
      }
LAB_0010cc16:
      iVar12 = psVar5->error;
    }
LAB_0010cc19:
    if (common->mark_ptr == 0) {
LAB_0010cc53:
      if (iVar12 == 0) {
LAB_0010cc57:
        uVar36 = *(ushort *)((long)&((backtrack_common *)cc)->prev + 2);
        psVar5->mode32 = 0;
        emit_mov(psVar5,0x8c,0x40,0x40,(ulong)uVar36);
        if (psVar5->error == 0) {
          uVar36 = *(ushort *)((long)&((backtrack_common *)cc)->prev + 4);
          psVar5->mode32 = 0;
          emit_mov(psVar5,0x8c,0x48,0x40,(ulong)uVar36);
        }
      }
    }
    else if (iVar12 == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,1,4,0,0x81,0x30);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
        iVar12 = psVar5->error;
        goto LAB_0010cc53;
      }
      if (psVar5->error != 0) goto LAB_0010cc9d;
      goto LAB_0010cc57;
    }
LAB_0010cc9d:
    if (*(short *)&((backtrack_common *)cc)->prev == 0x76) {
      srcw_00 = (undefined1 *)0x0;
      srcw = 0;
      uVar33 = 0;
    }
    else {
      srcw_00 = (undefined1 *)((long)&((backtrack_common *)cc)->nextbacktracks + 4);
      srcw = (ulong)((int)local_108 - 7);
      uVar33 = (ulong)*(ushort *)&((backtrack_common *)cc)->nextbacktracks;
    }
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      emit_mov(psVar5,0x8c,0x60,0x40,(sljit_sw)srcw_00);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        emit_mov(psVar5,0x8c,0x58,0x40,srcw);
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          emit_mov(psVar5,0x8c,0x50,0x40,uVar33);
        }
      }
    }
    sVar42 = 4;
    if (common->mark_ptr == 0) {
      sVar42 = 0x40;
    }
    offset = 0x18;
    sljit_emit_op1(psVar5,0x20,0x8c,0x18,(sljit_s32)sVar42,0);
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      offset = 0;
      sVar42 = 0x8e;
      psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x89;
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        offset = 0;
        sVar42 = 2;
        psVar15 = emit_x86_instruction(psVar5,1,0xc,0,2,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
    sljit_get_local_base(psVar5,3,(long)common->ovector_start,offset);
    sljit_emit_icall(psVar5,0x1113,0x1551f5,(sljit_s32)offset,sVar42);
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
    }
    sljit_emit_op2(common->compiler,0x60,0xc,0,0xc,0,0x40,uVar44);
    if (psVar5->error == 0) {
      psVar5->mode32 = 0x100;
      psVar15 = emit_x86_instruction(psVar5,0x11,0x40,0,1,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        psVar15[1] = psVar15[1] | 0x38;
      }
    }
    psVar16 = sljit_emit_jump(psVar5,0x108);
    if ((psVar5->error == 0) &&
       (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
      pjVar22->next = pbVar30->topbacktracks;
      pjVar22->jump = psVar16;
      pbVar30->topbacktracks = pjVar22;
    }
    psVar31 = common->abort_label;
    psVar16 = sljit_emit_jump(psVar5,0x101);
    if (psVar31 == (sljit_label *)0x0) {
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = common->abort;
        pjVar22->jump = psVar16;
        common->abort = pjVar22;
      }
    }
    else if ((psVar16 != (sljit_jump *)0x0) &&
            (psVar31 = common->abort_label, psVar31 != (sljit_label *)0x0)) {
      psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
      (psVar16->u).target = (sljit_uw)psVar31;
    }
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + (long)local_108 * 2);
    break;
  case 0x7e:
  case 0x7f:
  case 0x80:
  case 0x81:
    goto switchD_0010acd2_caseD_7e;
  case 0x82:
  case 0x83:
  case 0x85:
  case 0x87:
  case 0x88:
  case 0x8a:
  case 0x8c:
switchD_0010acd2_caseD_82:
    pbVar30 = (backtrack_common *)compile_bracket_matchingpath(common,cc,parent);
    break;
  case 0x84:
  case 0x86:
  case 0x89:
  case 0x8b:
  case 0x95:
    psVar5 = common->compiler;
    if ((psVar5->error != 0) ||
       (pbVar30 = (backtrack_common *)ensure_abuf(psVar5,0x38), psVar5->error != 0))
    goto LAB_0010ead9;
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30[1].prev = (backtrack_common *)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30[1].nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    sVar10 = *(short *)&((backtrack_common *)cc)->prev;
    pPVar28 = (PCRE2_SPTR16)((long)&((backtrack_common *)cc)->prev + (ulong)(sVar10 == 0x95) * 2);
    uVar36 = *pPVar28;
    iVar12 = *(int *)((long)common->private_data_ptrs + ((long)pPVar28 - (long)common->start) * 2);
    lVar19 = (long)iVar12;
    *(int *)&pbVar30[1].prev = iVar12;
    local_108 = (backtrack_common *)0x0;
    pPVar39 = (PCRE2_SPTR16)0x0;
    local_d8 = 0;
    switch(uVar36) {
    case 0x84:
    case 0x89:
      pPVar39 = pPVar28 + 2;
      local_d8 = 0;
      local_108 = (backtrack_common *)0x0;
      break;
    case 0x86:
    case 0x8b:
      local_108 = (backtrack_common *)(ulong)((uint)pPVar28[2] * 2);
      pPVar39 = pPVar28 + 3;
      local_d8 = (sljit_sw)(int)((uint)pPVar28[2] * 8 + common->cbra_ptr);
    }
    iVar13 = 1;
    iVar12 = get_framesize(common,pPVar28,(PCRE2_SPTR16)0x0,0,&needs_control_head);
    BVar32 = needs_control_head;
    *(int *)((long)&pbVar30[1].prev + 4) = iVar12;
    if (iVar12 < 0) {
      if ((int)local_108 != 0) {
        iVar13 = 3 - (uint)(common->capture_last_ptr == 0);
      }
      bVar49 = needs_control_head != 0;
      uVar11 = (uint)(sVar10 != 0x95) + iVar13 + (uint)bVar49;
      local_b0 = (ulong)uVar11;
      *(uint *)&pbVar30[1].nextbacktracks = uVar11;
      psVar6 = common->compiler;
      sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,(ulong)(uVar11 * 8));
      psVar16 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
      psVar6 = common->compiler;
      if ((psVar6->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar6,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar6);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      iVar37 = 1;
      if ((iVar12 == -1) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,0xc,0,0x8e,lVar19);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
      iVar13 = psVar5->error;
      if ((int)local_108 == 0) {
        if (BVar32 == 0) {
LAB_0010b33e:
          if (iVar13 == 0) {
LAB_0010b348:
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8c,0);
            goto joined_r0x0010b71b;
          }
        }
        else if (iVar13 == 0) {
          iVar13 = common->control_head_ptr;
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar13);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
            iVar13 = psVar5->error;
            goto LAB_0010b33e;
          }
          if (psVar5->error != 0) goto LAB_0010b722;
          goto LAB_0010b348;
        }
      }
      else {
        if (iVar13 == 0) {
          iVar13 = common->ovector_start;
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar13 + (long)local_108 * 8);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
          if (psVar5->error == 0) {
            iVar13 = common->ovector_start;
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar13 + (long)local_108 * 8 + 8)
            ;
            if (psVar15 == (sljit_u8 *)0x0) {
              if (psVar5->error != 0) goto LAB_0010b63c;
            }
            else {
              *psVar15 = 0x8b;
              iVar13 = psVar5->error;
              if (iVar13 != 0) goto LAB_0010b63f;
            }
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8c,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
          }
LAB_0010b63c:
          iVar13 = psVar5->error;
        }
LAB_0010b63f:
        iVar37 = common->capture_last_ptr;
        if ((long)iVar37 == 0) {
LAB_0010b67c:
          if (iVar13 == 0) {
LAB_0010b680:
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8c,8);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
          }
        }
        else if (iVar13 == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar37);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
            iVar13 = psVar5->error;
            goto LAB_0010b67c;
          }
          if (psVar5->error != 0) goto LAB_0010b6a9;
          goto LAB_0010b680;
        }
LAB_0010b6a9:
        if ((BVar32 != 0) && (psVar5->error == 0)) {
          iVar13 = common->control_head_ptr;
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar13);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
        }
        iVar37 = 2;
        if ((common->capture_last_ptr == 0) || (iVar37 = 3, psVar5->error != 0)) goto LAB_0010b722;
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8c,0x10);
        iVar37 = 3;
joined_r0x0010b71b:
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
LAB_0010b722:
      if ((sVar10 != 0x95) && (psVar5->error == 0)) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,0x40,1,0x8c,(ulong)(((uint)bVar49 + iVar37) * 8));
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 199;
        }
      }
      bVar49 = true;
      if (BVar32 != 0) {
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          bVar49 = false;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8c,(ulong)(uint)(iVar37 * 8));
          if (psVar15 == (sljit_u8 *)0x0) goto LAB_0010b80f;
          *psVar15 = 0x89;
        }
        bVar49 = false;
      }
    }
    else {
      iVar13 = ((uint)(sVar10 != 0x95) + iVar12 + (uint)((int)local_108 == 0)) -
               (uint)(needs_control_head == 0);
      uVar11 = iVar13 + 2;
      local_b0 = (ulong)uVar11;
      *(uint *)&pbVar30[1].nextbacktracks = uVar11;
      psVar6 = common->compiler;
      sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,local_b0 * 8);
      psVar16 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
      psVar6 = common->compiler;
      if ((psVar6->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar6,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar6);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      iVar37 = 1;
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,lVar19);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x8b;
        }
      }
      if ((BVar32 != 0) && (psVar5->error == 0)) {
        iVar41 = common->control_head_ptr;
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar41);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x8b;
        }
      }
      iVar41 = 0xc;
      sljit_emit_op2(psVar5,0x60,0x8e,lVar19,0xc,0,0x40,local_b0 * 8);
      iVar50 = 0;
      if (sVar10 == 0x95) {
LAB_0010b509:
        iVar37 = iVar50;
        sVar48 = psVar5->error;
      }
      else {
        sVar48 = psVar5->error;
        if (sVar48 == 0) {
          psVar5->mode32 = 0;
          iVar41 = 0x8c;
          psVar15 = emit_x86_instruction(psVar5,1,0x40,1,0x8c,0);
          iVar50 = iVar37;
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 199;
          }
          goto LAB_0010b509;
        }
      }
      if (BVar32 != 0) {
        if (sVar48 == 0) {
          psVar5->mode32 = 0;
          iVar41 = 0x8c;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8c,(ulong)(uint)(iVar37 * 8));
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
        }
        iVar37 = iVar37 + 1;
        sVar48 = psVar5->error;
      }
      if ((int)local_108 == 0) {
        if (sVar48 == 0) {
          psVar5->mode32 = 0;
          iVar41 = 0x8c;
          psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8c,(ulong)(uint)(iVar37 * 8));
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
        }
        iVar37 = iVar37 + 1;
        sVar48 = psVar5->error;
        iVar50 = -2;
      }
      else {
        iVar50 = -1;
      }
      if (sVar48 == 0) {
        psVar5->mode32 = 0;
        iVar41 = 0x8c;
        psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8c,(ulong)(uint)(iVar37 * 8));
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
      init_frame(common,pPVar28,(PCRE2_SPTR16)0x0,iVar13 + 1,iVar41);
      iVar37 = iVar37 + iVar50;
      bVar49 = BVar32 == 0;
    }
LAB_0010b80f:
    if (((int)local_108 != 0) && (psVar5->error == 0)) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,local_d8);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x89;
      }
    }
    psVar31 = sljit_emit_label(psVar5);
    iVar13 = (int)local_b0;
    if (*pPVar28 != 0x7c) {
      pbVar30->top = (backtrack_common *)0x0;
      pbVar30->topbacktracks = (jump_list *)0x0;
      pPVar28 = pPVar28 + pPVar28[1];
      compile_matchingpath(common,pPVar39,pPVar28,pbVar30);
      pbVar18 = local_108;
      if (psVar5->error != 0) goto LAB_0010df6e;
      local_48 = local_b0 << 3;
      local_58 = (ulong)((int)local_108 * 8 + 8);
      local_68 = (ulong)local_108 >> 1;
      local_50 = (ulong)(uint)((int)local_108 * 8);
      immb = (long)(iVar12 * -8 + -0x10);
      local_60 = (long)(iVar37 << 3);
      local_38 = (long)(iVar13 * 8 + -8);
      plVar46 = (long *)0x0;
LAB_0010b97b:
      if (iVar12 < 0) {
        if (iVar12 == -1) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,0xc,0,0x8e,lVar19);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
        }
        iVar37 = psVar5->error;
        if ((int)local_108 == 0) {
          if (uVar36 == 0x89) {
            if (iVar37 == 0) {
              psVar5->mode32 = 0;
              psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8c,0);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x8b;
                iVar37 = psVar5->error;
                goto LAB_0010ba09;
              }
              if (psVar5->error != 0) goto LAB_0010bc02;
              goto LAB_0010ba11;
            }
          }
          else {
LAB_0010ba09:
            if (iVar37 == 0) {
LAB_0010ba11:
              psVar5->mode32 = 0;
              sVar48 = 2;
              sVar40 = 0x8c;
              sVar42 = 0;
              goto LAB_0010bbf5;
            }
          }
        }
        else {
          if (iVar37 == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,local_d8);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x8b;
            }
            iVar37 = psVar5->error;
            if (iVar37 == 0) {
              iVar37 = common->ovector_start;
              psVar5->mode32 = 0;
              psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,(long)iVar37 + local_58);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x89;
              }
              iVar37 = psVar5->error;
              if (iVar37 == 0) {
                psVar5->mode32 = 0;
                psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,local_d8);
                if (psVar15 != (sljit_u8 *)0x0) {
                  *psVar15 = 0x89;
                }
                iVar37 = psVar5->error;
              }
            }
          }
          iVar41 = common->capture_last_ptr;
          if ((long)iVar41 != 0) {
            if (iVar37 != 0) goto LAB_0010bc02;
            psVar5->mode32 = 0;
            emit_mov(psVar5,0x8e,(long)iVar41,0x40,local_68);
            iVar37 = psVar5->error;
          }
          if (iVar37 != 0) goto LAB_0010bc02;
          sVar42 = (long)common->ovector_start + local_50;
          psVar5->mode32 = 0;
          sVar48 = 1;
          sVar40 = 0x8e;
LAB_0010bbf5:
          psVar15 = emit_x86_instruction(psVar5,1,sVar48,0,sVar40,sVar42);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
        }
LAB_0010bc02:
        if ((!bVar49) && (psVar5->error == 0)) {
          iVar37 = common->control_head_ptr;
          psVar5->mode32 = 0;
          emit_mov(psVar5,0x8e,(long)iVar37,0x8c,local_60);
        }
        if ((((uVar36 & 0xfffd) == 0x89) &&
            (psVar16 = sljit_emit_cmp(psVar5,0,1,0,2,0), psVar5->error == 0)) &&
           (plVar20 = (long *)ensure_abuf(psVar5,0x10), plVar20 != (long *)0x0)) {
          plVar20[1] = (long)plVar46;
          *plVar20 = (long)psVar16;
          plVar46 = plVar20;
        }
        if ((sVar10 != 0x95) && (psVar5->error == 0)) {
          psVar5->mode32 = 0;
          lVar43 = local_38;
LAB_0010be94:
          psVar15 = emit_x86_instruction(psVar5,1,0x40,0,0x8c,lVar43);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 199;
          }
        }
      }
      else {
        if ((int)local_108 == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,lVar19);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
          sljit_emit_op2(psVar5,0x62,0xc,0,4,0,0x40,local_48);
          iVar37 = psVar5->error;
          if (uVar36 == 0x89) {
            if (iVar37 == 0) {
              psVar5->mode32 = 0;
              psVar15 = emit_x86_instruction(psVar5,1,1,0,0x84,immb);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x8b;
                iVar37 = psVar5->error;
                goto LAB_0010bad2;
              }
              if (psVar5->error != 0) goto LAB_0010bdec;
              goto LAB_0010bada;
            }
          }
          else {
LAB_0010bad2:
            if (iVar37 == 0) {
LAB_0010bada:
              psVar5->mode32 = 0;
              sVar48 = 2;
              sVar40 = 0x84;
              lVar43 = immb;
              goto LAB_0010bddf;
            }
          }
        }
        else {
          sljit_emit_op2(psVar5,0x62,0xc,0,0x8e,lVar19,0x40,local_48);
          iVar37 = psVar5->error;
          if (iVar37 == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,local_d8);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x8b;
            }
            iVar37 = psVar5->error;
            if (iVar37 == 0) {
              iVar37 = common->ovector_start;
              psVar5->mode32 = 0;
              psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,(long)iVar37 + local_58);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x89;
              }
              iVar37 = psVar5->error;
              if (iVar37 == 0) {
                psVar5->mode32 = 0;
                psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,local_d8);
                if (psVar15 != (sljit_u8 *)0x0) {
                  *psVar15 = 0x89;
                }
                iVar37 = psVar5->error;
              }
            }
          }
          iVar41 = common->capture_last_ptr;
          if ((long)iVar41 != 0) {
            if (iVar37 != 0) goto LAB_0010bdec;
            psVar5->mode32 = 0;
            emit_mov(psVar5,0x8e,(long)iVar41,0x40,local_68);
            iVar37 = psVar5->error;
          }
          if (iVar37 != 0) goto LAB_0010bdec;
          lVar43 = (long)common->ovector_start + local_50;
          psVar5->mode32 = 0;
          sVar48 = 1;
          sVar40 = 0x8e;
LAB_0010bddf:
          psVar15 = emit_x86_instruction(psVar5,1,sVar48,0,sVar40,lVar43);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x89;
          }
        }
LAB_0010bdec:
        if ((!bVar49) && (psVar5->error == 0)) {
          iVar37 = common->control_head_ptr;
          psVar5->mode32 = 0;
          emit_mov(psVar5,0x8e,(long)iVar37,0x8c,local_60);
        }
        if ((((uVar36 & 0xfffd) == 0x89) &&
            (psVar16 = sljit_emit_cmp(psVar5,0,1,0,2,0), psVar5->error == 0)) &&
           (plVar20 = (long *)ensure_abuf(psVar5,0x10), plVar20 != (long *)0x0)) {
          plVar20[1] = (long)plVar46;
          *plVar20 = (long)psVar16;
          plVar46 = plVar20;
        }
        if ((sVar10 != 0x95) && (psVar5->error == 0)) {
          psVar5->mode32 = 0;
          lVar43 = 0;
          goto LAB_0010be94;
        }
      }
      psVar16 = sljit_emit_jump(psVar5,0x18);
      if ((psVar31 != (sljit_label *)0x0) && (psVar16 != (sljit_jump *)0x0)) {
        psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
        (psVar16->u).label = psVar31;
      }
      flush_stubs(common);
      compile_backtrackingpath(common,pbVar30->top);
      if (psVar5->error != 0) goto LAB_0010df6e;
      pjVar22 = pbVar30->topbacktracks;
      psVar21 = sljit_emit_label(psVar5);
      for (; pjVar22 != (jump_list *)0x0; pjVar22 = pjVar22->next) {
        if ((psVar21 != (sljit_label *)0x0) &&
           (psVar16 = pjVar22->jump, psVar16 != (sljit_jump *)0x0)) {
          psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
          (psVar16->u).label = psVar21;
        }
      }
      if (iVar12 < 0) {
        sVar48 = psVar5->error;
        if ((int)local_108 != 0) goto joined_r0x0010c0a7;
        if (sVar48 != 0) goto LAB_0010c044;
        psVar5->mode32 = 0;
        sVar48 = 0x8c;
        sVar42 = 0;
      }
      else {
        if ((int)local_108 == 0) {
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,lVar19);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x8b;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              sVar48 = 0x84;
              sVar42 = immb;
              goto LAB_0010c037;
            }
          }
          goto LAB_0010c044;
        }
        sVar48 = psVar5->error;
        if (*pPVar28 != 0x7c) goto joined_r0x0010c0a7;
        if (sVar48 != 0) {
          pbVar30->topbacktracks = (jump_list *)0x0;
          if (sVar10 == 0x95) goto LAB_0010ea26;
          goto LAB_0010e9d7;
        }
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,lVar19);
        if (psVar15 == (sljit_u8 *)0x0) {
          sVar48 = psVar5->error;
        }
        else {
          *psVar15 = 0x8b;
          sVar48 = psVar5->error;
        }
joined_r0x0010c0a7:
        if (sVar48 != 0) goto LAB_0010c044;
        psVar5->mode32 = 0;
        sVar48 = 0x8e;
        sVar42 = local_d8;
      }
LAB_0010c037:
      psVar15 = emit_x86_instruction(psVar5,1,2,0,sVar48,sVar42);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
LAB_0010c044:
      if (*pPVar28 == 0x7c) goto LAB_0010b859;
      pPVar39 = pPVar28 + 2;
      pbVar30->top = (backtrack_common *)0x0;
      pbVar30->topbacktracks = (jump_list *)0x0;
      pPVar28 = pPVar28 + pPVar28[1];
      compile_matchingpath(common,pPVar39,pPVar28,pbVar30);
      if (psVar5->error != 0) goto LAB_0010df6e;
      goto LAB_0010b97b;
    }
    plVar46 = (long *)0x0;
LAB_0010b859:
    pbVar30->topbacktracks = (jump_list *)0x0;
    if (sVar10 != 0x95) {
      if (iVar12 < 0) {
        iVar13 = iVar13 * 8 + -8;
        sVar48 = 0x8c;
      }
      else {
LAB_0010e9d7:
        iVar13 = iVar13 * -8;
        sVar48 = 0x84;
      }
      psVar16 = sljit_emit_cmp(psVar5,1,sVar48,(long)iVar13,0x40,0);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = pbVar30->topbacktracks;
        pjVar22->jump = psVar16;
        pbVar30->topbacktracks = pjVar22;
      }
    }
LAB_0010ea26:
    psVar31 = sljit_emit_label(psVar5);
    for (; plVar46 != (long *)0x0; plVar46 = (long *)plVar46[1]) {
      if ((psVar31 != (sljit_label *)0x0) && (lVar19 = *plVar46, lVar19 != 0)) {
        *(ulong *)(lVar19 + 0x10) = (*(ulong *)(lVar19 + 0x10) & 0xfffffffffffffffc) + 1;
        *(sljit_label **)(lVar19 + 0x18) = psVar31;
      }
    }
    psVar5 = common->compiler;
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,0x11,0x40,1,10,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        psVar15[1] = psVar15[1] | 0x28;
      }
    }
    psVar16 = sljit_emit_jump(psVar5,0);
    if ((psVar5->error == 0) &&
       (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
      pjVar22->next = common->calllimit;
      pjVar22->jump = psVar16;
      common->calllimit = pjVar22;
    }
    pbVar30 = (backtrack_common *)(pPVar28 + 2);
    break;
  case 0x93:
    if (0x81 < *(ushort *)((long)&((backtrack_common *)cc)->prev + 2))
    goto switchD_0010acd2_caseD_82;
    goto switchD_0010acd2_caseD_7e;
  case 0x94:
    if (compiler->error != 0) {
      return;
    }
    pbVar30 = (backtrack_common *)ensure_abuf(compiler,0x30);
    if (compiler->error != 0) {
      return;
    }
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30[1].prev = (backtrack_common *)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    psVar45 = (short *)((long)&((backtrack_common *)cc)->prev + 2);
    do {
      psVar45 = psVar45 + (ushort)psVar45[1];
    } while (*psVar45 == 0x78);
    psVar5 = common->compiler;
    if (*psVar45 == 0x7b) {
      sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,0x10);
      psVar16 = sljit_emit_cmp(psVar5,2,0xc,0,0xb,0);
      psVar5 = common->compiler;
      if ((psVar5->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar5,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar5);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        psVar15 = emit_x86_instruction(compiler,1,0x40,0,0x8c,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 199;
        }
        if (compiler->error == 0) {
          compiler->mode32 = 0;
          sVar42 = 8;
          goto LAB_0010d04b;
        }
      }
    }
    else {
      sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,8);
      psVar16 = sljit_emit_cmp(psVar5,2,0xc,0,0xb,0);
      psVar5 = common->compiler;
      if ((psVar5->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar5,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar5);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      if (compiler->error == 0) {
        compiler->mode32 = 0;
        sVar42 = 0;
LAB_0010d04b:
        psVar15 = emit_x86_instruction(compiler,1,2,0,0x8c,sVar42);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
    pbVar18 = (backtrack_common *)sljit_emit_label(compiler);
    pbVar30[1].prev = pbVar18;
    psVar5 = common->compiler;
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,0x11,0x40,1,10,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        psVar15[1] = psVar15[1] | 0x28;
      }
    }
    pbVar30 = (backtrack_common *)(psVar45 + 2);
    psVar16 = sljit_emit_jump(psVar5,0);
    if ((psVar5->error == 0) &&
       (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
      pjVar22->next = common->calllimit;
      pjVar22->jump = psVar16;
      common->calllimit = pjVar22;
    }
    break;
  case 0x96:
    if (compiler->error != 0) {
      return;
    }
    pbVar30 = (backtrack_common *)ensure_abuf(compiler,0x28);
    if (compiler->error != 0) {
      return;
    }
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    pbVar30->topbacktracks = (jump_list *)0x0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    if (compiler->error == 0) {
      iVar12 = common->mark_ptr;
      compiler->mode32 = 0;
      psVar15 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar12);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
    }
    psVar5 = common->compiler;
    sljit_emit_op2(psVar5,0x62,0xc,0,0xc,0,0x40,(ulong)(common->has_skip_arg != 0) << 5 | 8);
    psVar16 = sljit_emit_cmp(psVar5,2,0xc,0,0xb,0);
    psVar5 = common->compiler;
    if ((psVar5->error == 0) &&
       (psVar17 = (stub_list *)ensure_abuf(psVar5,0x18), psVar17 != (stub_list *)0x0)) {
      psVar17->start = psVar16;
      psVar31 = sljit_emit_label(psVar5);
      psVar17->quit = psVar31;
      psVar17->next = common->stubs;
      common->stubs = psVar17;
    }
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar15 = emit_x86_instruction(compiler,1,9,0,1,0);
      if (psVar15 == (sljit_u8 *)0x0) {
        if (compiler->error == 0) {
          iVar12 = common->has_skip_arg;
          goto LAB_0010c1f5;
        }
      }
      else {
        *psVar15 = 0x89;
        iVar12 = common->has_skip_arg;
        if (compiler->error == 0) {
LAB_0010c1f5:
          compiler->mode32 = 0;
          psVar15 = emit_x86_instruction(compiler,1,4,0,0x8c,(ulong)(iVar12 != 0) << 5);
          if (psVar15 == (sljit_u8 *)0x0) {
            iVar12 = compiler->error;
          }
          else {
            *psVar15 = 0x89;
            iVar12 = compiler->error;
          }
          if (iVar12 == 0) {
            compiler->mode32 = 0;
            emit_mov(compiler,4,0,0x40,(sljit_sw)((long)&((backtrack_common *)cc)->prev + 4));
            if (compiler->error == 0) {
              iVar12 = common->mark_ptr;
              compiler->mode32 = 0;
              psVar15 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar12);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x89;
              }
              if (compiler->error == 0) {
                compiler->mode32 = 0;
                psVar15 = emit_x86_instruction(compiler,1,4,0,0x81,0x30);
                if (psVar15 != (sljit_u8 *)0x0) {
                  *psVar15 = 0x89;
                }
              }
            }
          }
        }
      }
    }
    if ((common->has_skip_arg != 0) && (compiler->error == 0)) {
      iVar12 = common->control_head_ptr;
      compiler->mode32 = 0;
      psVar15 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar12);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = 0x8b;
      }
      if (compiler->error == 0) {
        iVar12 = common->control_head_ptr;
        compiler->mode32 = 0;
        psVar15 = emit_x86_instruction(compiler,1,0xc,0,0x8e,(long)iVar12);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (compiler->error == 0) {
          compiler->mode32 = 0;
          psVar15 = emit_x86_instruction(compiler,1,0x40,0,0x8c,8);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 199;
          }
          if (compiler->error == 0) {
            compiler->mode32 = 0;
            emit_mov(compiler,0x8c,0x10,0x40,(sljit_sw)((long)&((backtrack_common *)cc)->prev + 4));
            if (compiler->error == 0) {
              compiler->mode32 = 0;
              psVar15 = emit_x86_instruction(compiler,1,2,0,0x8c,0x18);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x89;
              }
              if (compiler->error == 0) {
                compiler->mode32 = 0;
                psVar15 = emit_x86_instruction(compiler,1,1,0,0x8c,0);
                if (psVar15 != (sljit_u8 *)0x0) {
                  *psVar15 = 0x89;
                }
              }
            }
          }
        }
      }
    }
    pbVar30 = (backtrack_common *)
              ((long)&((backtrack_common *)cc)->prev +
              (ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 2) * 2 + 6);
    break;
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 2);
    uVar11 = uVar36 - 0x98;
    if ((uVar11 < 7) && ((0x55U >> (uVar11 & 0x1f) & 1) != 0)) {
      pbVar30 = (backtrack_common *)
                ((long)&pbVar30->prev + (ulong)*(ushort *)&pbVar30->prev * 2 + 4);
    }
    psVar5 = common->compiler;
    if (psVar5->error != 0) {
      return;
    }
    pbVar18 = (backtrack_common *)ensure_abuf(psVar5,0x28);
    if (psVar5->error != 0) {
      return;
    }
    pbVar18->top = (backtrack_common *)0x0;
    pbVar18->topbacktracks = (jump_list *)0x0;
    pbVar18->prev = (backtrack_common *)0x0;
    pbVar18->nextbacktracks = (jump_list *)0x0;
    pbVar18->cc = (PCRE2_SPTR16)0x0;
    pbVar18->prev = parent->top;
    pbVar18->cc = cc;
    parent->top = pbVar18;
    switch(uVar11) {
    case 0:
    case 4:
    case 6:
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          sVar48 = 4;
          emit_mov(psVar5,4,0,0x40,(sljit_sw)((long)&((backtrack_common *)cc)->prev + 4));
          if (psVar5->error == 0) {
            iVar12 = common->mark_ptr;
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,4,0,0x8e,(long)iVar12);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 0;
              sVar40 = 0x81;
              sVar42 = 0x30;
              goto LAB_0010afb1;
            }
          }
        }
      }
      break;
    case 1:
      psVar6 = common->compiler;
      sljit_emit_op2(psVar6,0x62,0xc,0,0xc,0,0x40,8);
      psVar16 = sljit_emit_cmp(psVar6,2,0xc,0,0xb,0);
      psVar6 = common->compiler;
      if ((psVar6->error == 0) &&
         (psVar17 = (stub_list *)ensure_abuf(psVar6,0x18), psVar17 != (stub_list *)0x0)) {
        psVar17->start = psVar16;
        psVar31 = sljit_emit_label(psVar6);
        psVar17->quit = psVar31;
        psVar17->next = common->stubs;
        common->stubs = psVar17;
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        sVar48 = 2;
        sVar40 = 0x8c;
        sVar42 = 0;
LAB_0010afb1:
        psVar15 = emit_x86_instruction(psVar5,1,sVar48,0,sVar40,sVar42);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
    break;
  case 0x9f:
  case 0xa0:
  case 0xa1:
    psVar5 = common->compiler;
    if (psVar5->error != 0) {
      return;
    }
    pbVar30 = (backtrack_common *)ensure_abuf(psVar5,0x28);
    if (psVar5->error != 0) {
      return;
    }
    pbVar30->cc = (PCRE2_SPTR16)0x0;
    pbVar30->top = (backtrack_common *)0x0;
    ((anon_union_8_2_cb96b71c_for_u *)&pbVar30->topbacktracks)->target = 0;
    pbVar30->prev = (backtrack_common *)0x0;
    pbVar30->nextbacktracks = (jump_list *)0x0;
    pbVar30->prev = parent->top;
    pbVar30->cc = cc;
    parent->top = pbVar30;
    sVar10 = *(short *)&((backtrack_common *)cc)->prev;
    if (sVar10 == 0xa0) {
      if (common->currententry == (recurse_entry *)0x0) {
        if ((((common->re->overall_options & 0x20000000) != 0) &&
            (psVar16 = sljit_emit_cmp(psVar5,1,2,0,0xd,0), psVar5->error == 0)) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = common->reset_match;
          pjVar22->jump = psVar16;
          common->reset_match = pjVar22;
        }
        sVar10 = *(short *)&((backtrack_common *)cc)->prev;
        goto LAB_0010caaf;
      }
LAB_0010cacc:
      psVar31 = common->accept_label;
      pbVar30 = (backtrack_common *)sljit_emit_jump(psVar5,0x18);
      if (psVar31 == (sljit_label *)0x0) {
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = common->accept;
          pjVar22->jump = (sljit_jump *)pbVar30;
          common->accept = pjVar22;
        }
      }
      else if ((pbVar30 != (backtrack_common *)0x0) &&
              (psVar31 = common->accept_label, psVar31 != (sljit_label *)0x0)) {
        pbVar30->top = (backtrack_common *)(((ulong)pbVar30->top & 0xfffffffffffffffc) + 1);
        goto LAB_0010cb11;
      }
    }
    else {
      if (sVar10 != 0x9f) {
LAB_0010caaf:
        if (((sVar10 == 0xa1) || (common->currententry != (recurse_entry *)0x0)) ||
           (common->might_be_empty == 0)) goto LAB_0010cacc;
        psVar31 = common->accept_label;
        psVar16 = sljit_emit_cmp(psVar5,1,2,0,0x8e,(long)common->ovector_start);
        if (psVar31 == (sljit_label *)0x0) {
          if (psVar5->error == 0) {
            pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
            if (pjVar22 != (jump_list *)0x0) {
              pjVar22->next = common->accept;
              pjVar22->jump = psVar16;
              common->accept = pjVar22;
            }
            goto LAB_0010df9f;
          }
        }
        else {
          if ((psVar16 != (sljit_jump *)0x0) &&
             (psVar31 = common->accept_label, psVar31 != (sljit_label *)0x0)) {
            psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
            (psVar16->u).target = (sljit_uw)psVar31;
          }
LAB_0010df9f:
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,9,0,1,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x89;
            }
            if (psVar5->error == 0) {
              psVar5->mode32 = 1;
              psVar15 = emit_x86_instruction(psVar5,1,4,0,0x81,0x58);
              if (psVar15 != (sljit_u8 *)0x0) {
                *psVar15 = 0x8b;
                psVar5->mode32 = 0;
              }
              if (psVar5->error == 0) {
                psVar5->mode32 = 0;
                psVar15 = emit_x86_instruction(psVar5,1,0x40,4,4,0);
                if (psVar15 != (sljit_u8 *)0x0) {
                  *psVar15 = 0xf7;
                }
              }
            }
          }
        }
        psVar16 = sljit_emit_jump(psVar5,1);
        if (psVar5->error == 0) {
          psVar31 = (sljit_label *)ensure_abuf(psVar5,0x10);
          if (psVar31 != (sljit_label *)0x0) {
            psVar31->addr = (sljit_uw)*(anon_union_8_2_cb96b71c_for_u *)&pbVar30->topbacktracks;
            psVar31->next = (sljit_label *)psVar16;
            ((anon_union_8_2_cb96b71c_for_u *)&pbVar30->topbacktracks)->label = psVar31;
          }
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,0x40,8,4,0);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0xf7;
            }
          }
        }
        psVar31 = common->accept_label;
        psVar16 = sljit_emit_jump(psVar5,0);
        if (psVar31 == (sljit_label *)0x0) {
          if (psVar5->error == 0) {
            pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
            if (pjVar22 != (jump_list *)0x0) {
              pjVar22->next = common->accept;
              pjVar22->jump = psVar16;
              common->accept = pjVar22;
            }
            goto LAB_0010e113;
          }
        }
        else {
          if ((psVar16 != (sljit_jump *)0x0) &&
             (psVar31 = common->accept_label, psVar31 != (sljit_label *)0x0)) {
            psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
            (psVar16->u).target = (sljit_uw)psVar31;
          }
LAB_0010e113:
          if (psVar5->error == 0) {
            psVar5->mode32 = 0;
            psVar15 = emit_x86_instruction(psVar5,1,4,0,0x81,8);
            if (psVar15 != (sljit_u8 *)0x0) {
              *psVar15 = 0x8b;
            }
          }
        }
        psVar31 = common->accept_label;
        psVar16 = sljit_emit_cmp(psVar5,1,4,0,2,0);
        if (psVar31 == (sljit_label *)0x0) {
          if ((psVar5->error == 0) &&
             (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
            pjVar22->next = common->accept;
            pjVar22->jump = psVar16;
            common->accept = pjVar22;
          }
        }
        else if ((psVar16 != (sljit_jump *)0x0) &&
                (psVar31 = common->accept_label, psVar31 != (sljit_label *)0x0)) {
          psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
          (psVar16->u).target = (sljit_uw)psVar31;
        }
      }
      psVar16 = sljit_emit_jump(psVar5,0x18);
      if ((psVar5->error == 0) &&
         (psVar31 = (sljit_label *)ensure_abuf(psVar5,0x10), psVar31 != (sljit_label *)0x0)) {
        psVar31->addr = (sljit_uw)*(anon_union_8_2_cb96b71c_for_u *)&pbVar30->topbacktracks;
        psVar31->next = (sljit_label *)psVar16;
LAB_0010cb11:
        ((anon_union_8_2_cb96b71c_for_u *)&pbVar30->topbacktracks)->label = psVar31;
      }
    }
LAB_0010cb16:
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 2);
    break;
  case 0xa2:
    if (common->currententry == (recurse_entry *)0x0) {
      psVar5 = common->compiler;
      uVar36 = *(ushort *)((long)&((backtrack_common *)cc)->prev + 2);
      sVar2 = common->optimized_cbracket[uVar36];
      if (sVar2 == '\0') {
        if (psVar5->error != 0) goto LAB_0010e4aa;
        iVar12 = common->cbra_ptr;
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,(long)iVar12 + (ulong)uVar36 * 8);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x8b;
        }
      }
      if (psVar5->error == 0) {
        iVar12 = common->ovector_start;
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,(long)iVar12 + (ulong)uVar36 * 0x10 + 8);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
      if ((sVar2 == '\0') && (psVar5->error == 0)) {
        iVar12 = common->ovector_start;
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,1,1,0,0x8e,(ulong)uVar36 * 0x10 + (long)iVar12);
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
    }
LAB_0010e4aa:
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 4);
    break;
  case 0xa3:
    cc = (PCRE2_SPTR16)((long)&((backtrack_common *)cc)->prev + 2);
    do {
      cc = (PCRE2_SPTR16)
           ((long)&((backtrack_common *)cc)->prev +
           (ulong)*(ushort *)((long)&((backtrack_common *)cc)->prev + 2) * 2);
    } while (*(short *)&((backtrack_common *)cc)->prev == 0x78);
LAB_0010d1d3:
    pbVar30 = (backtrack_common *)((long)&((backtrack_common *)cc)->prev + 4);
  }
  goto switchD_0010aeee_caseD_2;
switchD_0010acd2_caseD_7e:
  if (compiler->error != 0) {
    return;
  }
  backtrack = (assert_backtrack *)ensure_abuf(compiler,0x40);
  if (compiler->error != 0) {
    return;
  }
  backtrack->framesize = 0;
  backtrack->private_data_ptr = 0;
  backtrack->matchingpath = (sljit_label *)0x0;
  (backtrack->common).cc = (PCRE2_SPTR16)0x0;
  backtrack->condfailed = (jump_list *)0x0;
  (backtrack->common).top = (backtrack_common *)0x0;
  (backtrack->common).topbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = (backtrack_common *)0x0;
  (backtrack->common).nextbacktracks = (jump_list *)0x0;
  (backtrack->common).prev = parent->top;
  (backtrack->common).cc = cc;
  parent->top = (backtrack_common *)backtrack;
  pbVar30 = (backtrack_common *)compile_assert_matchingpath(common,cc,backtrack,0);
switchD_0010aeee_caseD_2:
  cc = (PCRE2_SPTR16)pbVar30;
  if (pbVar30 == (backtrack_common *)0x0) {
switchD_0010acd2_caseD_62:
    return;
  }
  goto LAB_0010aca2;
switchD_0010acd2_caseD_21:
  pbVar30 = (backtrack_common *)compile_iterator_matchingpath(common,cc,parent);
  goto switchD_0010aeee_caseD_2;
switchD_0010acd2_caseD_6:
  ppjVar34 = &parent->top->nextbacktracks;
  if (parent->top == (backtrack_common *)0x0) {
    ppjVar34 = ppjVar1;
  }
LAB_0010dcff:
  pbVar30 = (backtrack_common *)
            compile_char1_matchingpath
                      (common,uVar36,(PCRE2_SPTR16)((long)&((backtrack_common *)cc)->prev + 2),
                       ppjVar34,1);
  goto switchD_0010aeee_caseD_2;
switchD_0010ad14_caseD_17:
  psVar16 = sljit_emit_cmp(psVar5,3,2,0,0xd,0);
  if (common->nltype == 0) {
    if (common->newline < 0x100) {
      sljit_emit_op2(psVar5,0x60,4,0,2,0,0x40,2);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          psVar15[0] = '\x0f';
          psVar15[1] = 0xb7;
        }
      }
      psVar24 = sljit_emit_cmp(psVar5,1,4,0,0xd,0);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      uVar44 = (ulong)common->newline;
      sVar48 = 1;
    }
    else {
      sljit_emit_op2(psVar5,0x60,4,0,2,0,0x40,4);
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,0);
        if (psVar15 != (sljit_u8 *)0x0) {
          psVar15[0] = '\x0f';
          psVar15[1] = 0xb7;
        }
      }
      if (common->mode == 1) {
        psVar24 = sljit_emit_cmp(psVar5,1,4,0,0xd,0);
        if (psVar5->error == 0) {
          pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
          if (pjVar22 != (jump_list *)0x0) {
            pjVar22->next = *ppjVar34;
            pjVar22->jump = psVar24;
            *ppjVar34 = pjVar22;
          }
          goto LAB_0010e690;
        }
      }
      else {
        uVar11 = 0xd;
        psVar24 = sljit_emit_cmp(psVar5,0,4,0,0xd,0);
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          uVar11 = 0xd;
          psVar15 = emit_x86_instruction(psVar5,1,4,0,0xd,0);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = ';';
          }
        }
        sljit_emit_op_flags(psVar5,0x20,4,2,uVar11);
        if (psVar5->error == 0) {
          bVar3 = *(byte *)((long)&common->newline + 1);
          uVar11 = (uint)bVar3;
          psVar5->mode32 = 0;
          emit_cmp_binary(psVar5,1,0,0x40,(ulong)bVar3);
        }
        sljit_emit_op_flags(psVar5,0x266,4,1,uVar11);
        psVar29 = sljit_emit_jump(psVar5,1);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar29;
          *ppjVar34 = pjVar22;
        }
        check_partial(common,1);
        psVar29 = sljit_emit_jump(psVar5,0x18);
        if ((psVar5->error == 0) &&
           (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar29;
          *ppjVar34 = pjVar22;
        }
        psVar31 = sljit_emit_label(psVar5);
        if ((psVar24 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
          psVar24->flags = (psVar24->flags & 0xfffffffffffffffcU) + 1;
          (psVar24->u).label = psVar31;
        }
LAB_0010e690:
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,2,4,0,0x82,2);
          if (psVar15 != (sljit_u8 *)0x0) {
            psVar15[0] = '\x0f';
            psVar15[1] = 0xb7;
          }
        }
      }
      psVar24 = sljit_emit_cmp(psVar5,1,1,0,0x40,(ulong)*(byte *)((long)&common->newline + 1));
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      uVar44 = (ulong)(byte)common->newline;
      sVar48 = 4;
    }
    psVar24 = sljit_emit_cmp(psVar5,1,sVar48,0,0x40,uVar44);
    if ((psVar5->error == 0) &&
       (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
      pjVar22->next = *ppjVar34;
      pjVar22->jump = psVar24;
      *ppjVar34 = pjVar22;
    }
  }
  else {
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        psVar15[0] = '\x0f';
        psVar15[1] = 0xb7;
      }
    }
    psVar24 = sljit_emit_cmp(psVar5,1,1,0,0x40,0xd);
    sljit_emit_op2(psVar5,0x60,4,0,2,0,0x40,4);
    if (psVar5->error == 0) {
      psVar5->mode32 = 0;
      psVar15 = emit_x86_instruction(psVar5,1,4,0,0xd,0);
      if (psVar15 != (sljit_u8 *)0x0) {
        *psVar15 = ';';
      }
    }
    psVar29 = sljit_emit_jump(psVar5,4);
    psVar25 = sljit_emit_jump(psVar5,1);
    if (psVar5->error == 0) {
      pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
      if (pjVar22 != (jump_list *)0x0) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar25;
        *ppjVar34 = pjVar22;
      }
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        psVar15 = emit_x86_instruction(psVar5,2,1,0,0x82,2);
        if (psVar15 != (sljit_u8 *)0x0) {
          psVar15[0] = '\x0f';
          psVar15[1] = 0xb7;
        }
      }
    }
    pjVar22 = (jump_list *)0x0;
    psVar25 = sljit_emit_cmp(psVar5,0,1,0,0x40,10);
    sVar38 = 0x18;
    psVar26 = sljit_emit_jump(psVar5,0x18);
    if (psVar5->error == 0) {
      sVar38 = 0x10;
      pjVar27 = (jump_list *)ensure_abuf(psVar5,0x10);
      if (pjVar27 != (jump_list *)0x0) {
        pjVar22 = *ppjVar34;
        pjVar27->next = pjVar22;
        pjVar27->jump = psVar26;
        *ppjVar34 = pjVar27;
      }
    }
    psVar31 = sljit_emit_label(psVar5);
    if ((psVar24 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
      pjVar22 = (jump_list *)((psVar24->flags & 0xfffffffffffffffcU) + 1);
      psVar24->flags = (sljit_sw)pjVar22;
      (psVar24->u).label = psVar31;
    }
    BVar32 = (BOOL)pjVar22;
    if (common->nltype == 2) {
      sljit_emit_op2(psVar5,0x60,4,0,2,0,0x40,2);
      psVar24 = sljit_emit_cmp(psVar5,2,4,0,0xd,0);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      psVar24 = sljit_emit_cmp(psVar5,1,1,0,0x40,10);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
    }
    else {
      sVar35 = extraout_EDX;
      if (psVar5->error == 0) {
        psVar5->mode32 = 0;
        BVar32 = 0;
        sVar38 = 1;
        psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,8);
        sVar35 = extraout_EDX_00;
        if (psVar15 != (sljit_u8 *)0x0) {
          *psVar15 = 0x89;
        }
      }
      read_char_range((compiler_common *)common->compiler,sVar38,sVar35,BVar32);
      psVar24 = sljit_emit_cmp(psVar5,1,2,0,0xd,0);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = *ppjVar34;
        pjVar22->jump = psVar24;
        *ppjVar34 = pjVar22;
      }
      psVar24 = sljit_emit_jump(psVar5,0x19);
      if ((psVar5->error == 0) &&
         (pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10), pjVar22 != (jump_list *)0x0)) {
        pjVar22->next = common->anynewline;
        pjVar22->jump = psVar24;
        common->anynewline = pjVar22;
      }
      psVar24 = sljit_emit_jump(psVar5,0);
      if (psVar5->error == 0) {
        pjVar22 = (jump_list *)ensure_abuf(psVar5,0x10);
        if (pjVar22 != (jump_list *)0x0) {
          pjVar22->next = *ppjVar34;
          pjVar22->jump = psVar24;
          *ppjVar34 = pjVar22;
        }
        if (psVar5->error == 0) {
          psVar5->mode32 = 0;
          psVar15 = emit_x86_instruction(psVar5,1,2,0,0x8e,8);
          if (psVar15 != (sljit_u8 *)0x0) {
            *psVar15 = 0x8b;
          }
        }
      }
    }
    psVar31 = sljit_emit_label(psVar5);
    if ((psVar29 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
      psVar29->flags = (psVar29->flags & 0xfffffffffffffffcU) + 1;
      (psVar29->u).label = psVar31;
    }
    psVar31 = sljit_emit_label(psVar5);
    if ((psVar25 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
      psVar25->flags = (psVar25->flags & 0xfffffffffffffffcU) + 1;
      (psVar25->u).label = psVar31;
    }
  }
  psVar31 = sljit_emit_label(psVar5);
  if ((psVar16 != (sljit_jump *)0x0) && (psVar31 != (sljit_label *)0x0)) {
    psVar16->flags = (psVar16->flags & 0xfffffffffffffffcU) + 1;
    (psVar16->u).label = psVar31;
  }
LAB_0010e772:
  check_partial(common,0);
LAB_0010b0bc:
  if (bVar49) {
    pbVar30 = local_108;
  }
  goto switchD_0010aeee_caseD_2;
}

Assistant:

static void compile_matchingpath(compiler_common *common, PCRE2_SPTR cc, PCRE2_SPTR ccend, backtrack_common *parent)
{
DEFINE_COMPILER;
backtrack_common *backtrack;
BOOL has_then_trap = FALSE;
then_trap_backtrack *save_then_trap = NULL;

SLJIT_ASSERT(*ccend == OP_END || (*ccend >= OP_ALT && *ccend <= OP_KETRPOS));

if (common->has_then && common->then_offsets[cc - common->start] != 0)
  {
  SLJIT_ASSERT(*ccend != OP_END && common->control_head_ptr != 0);
  has_then_trap = TRUE;
  save_then_trap = common->then_trap;
  /* Tail item on backtrack. */
  compile_then_trap_matchingpath(common, cc, ccend, parent);
  }

while (cc < ccend)
  {
  switch(*cc)
    {
    case OP_SOD:
    case OP_SOM:
    case OP_NOT_WORD_BOUNDARY:
    case OP_WORD_BOUNDARY:
    case OP_EODN:
    case OP_EOD:
    case OP_DOLL:
    case OP_DOLLM:
    case OP_CIRC:
    case OP_CIRCM:
    case OP_REVERSE:
    cc = compile_simple_assertion_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    break;

    case OP_NOT_DIGIT:
    case OP_DIGIT:
    case OP_NOT_WHITESPACE:
    case OP_WHITESPACE:
    case OP_NOT_WORDCHAR:
    case OP_WORDCHAR:
    case OP_ANY:
    case OP_ALLANY:
    case OP_ANYBYTE:
    case OP_NOTPROP:
    case OP_PROP:
    case OP_ANYNL:
    case OP_NOT_HSPACE:
    case OP_HSPACE:
    case OP_NOT_VSPACE:
    case OP_VSPACE:
    case OP_EXTUNI:
    case OP_NOT:
    case OP_NOTI:
    cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_SET_SOM:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(0));
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP2, 0);
    cc++;
    break;

    case OP_CHAR:
    case OP_CHARI:
    if (common->mode == PCRE2_JIT_COMPLETE)
      cc = compile_charn_matchingpath(common, cc, ccend, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

    case OP_STAR:
    case OP_MINSTAR:
    case OP_PLUS:
    case OP_MINPLUS:
    case OP_QUERY:
    case OP_MINQUERY:
    case OP_UPTO:
    case OP_MINUPTO:
    case OP_EXACT:
    case OP_POSSTAR:
    case OP_POSPLUS:
    case OP_POSQUERY:
    case OP_POSUPTO:
    case OP_STARI:
    case OP_MINSTARI:
    case OP_PLUSI:
    case OP_MINPLUSI:
    case OP_QUERYI:
    case OP_MINQUERYI:
    case OP_UPTOI:
    case OP_MINUPTOI:
    case OP_EXACTI:
    case OP_POSSTARI:
    case OP_POSPLUSI:
    case OP_POSQUERYI:
    case OP_POSUPTOI:
    case OP_NOTSTAR:
    case OP_NOTMINSTAR:
    case OP_NOTPLUS:
    case OP_NOTMINPLUS:
    case OP_NOTQUERY:
    case OP_NOTMINQUERY:
    case OP_NOTUPTO:
    case OP_NOTMINUPTO:
    case OP_NOTEXACT:
    case OP_NOTPOSSTAR:
    case OP_NOTPOSPLUS:
    case OP_NOTPOSQUERY:
    case OP_NOTPOSUPTO:
    case OP_NOTSTARI:
    case OP_NOTMINSTARI:
    case OP_NOTPLUSI:
    case OP_NOTMINPLUSI:
    case OP_NOTQUERYI:
    case OP_NOTMINQUERYI:
    case OP_NOTUPTOI:
    case OP_NOTMINUPTOI:
    case OP_NOTEXACTI:
    case OP_NOTPOSSTARI:
    case OP_NOTPOSPLUSI:
    case OP_NOTPOSQUERYI:
    case OP_NOTPOSUPTOI:
    case OP_TYPESTAR:
    case OP_TYPEMINSTAR:
    case OP_TYPEPLUS:
    case OP_TYPEMINPLUS:
    case OP_TYPEQUERY:
    case OP_TYPEMINQUERY:
    case OP_TYPEUPTO:
    case OP_TYPEMINUPTO:
    case OP_TYPEEXACT:
    case OP_TYPEPOSSTAR:
    case OP_TYPEPOSPLUS:
    case OP_TYPEPOSQUERY:
    case OP_TYPEPOSUPTO:
    cc = compile_iterator_matchingpath(common, cc, parent);
    break;

    case OP_CLASS:
    case OP_NCLASS:
    if (cc[1 + (32 / sizeof(PCRE2_UCHAR))] >= OP_CRSTAR && cc[1 + (32 / sizeof(PCRE2_UCHAR))] <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;

#if defined SUPPORT_UNICODE || PCRE2_CODE_UNIT_WIDTH == 16 || PCRE2_CODE_UNIT_WIDTH == 32
    case OP_XCLASS:
    if (*(cc + GET(cc, 1)) >= OP_CRSTAR && *(cc + GET(cc, 1)) <= OP_CRPOSRANGE)
      cc = compile_iterator_matchingpath(common, cc, parent);
    else
      cc = compile_char1_matchingpath(common, *cc, cc + 1, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE);
    break;
#endif

    case OP_REF:
    case OP_REFI:
    if (cc[1 + IMM2_SIZE] >= OP_CRSTAR && cc[1 + IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + IMM2_SIZE;
      }
    break;

    case OP_DNREF:
    case OP_DNREFI:
    if (cc[1 + 2 * IMM2_SIZE] >= OP_CRSTAR && cc[1 + 2 * IMM2_SIZE] <= OP_CRPOSRANGE)
      cc = compile_ref_iterator_matchingpath(common, cc, parent);
    else
      {
      compile_dnref_search(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks);
      compile_ref_matchingpath(common, cc, parent->top != NULL ? &parent->top->nextbacktracks : &parent->topbacktracks, TRUE, FALSE);
      cc += 1 + 2 * IMM2_SIZE;
      }
    break;

    case OP_RECURSE:
    cc = compile_recurse_matchingpath(common, cc, parent);
    break;

    case OP_CALLOUT:
    case OP_CALLOUT_STR:
    cc = compile_callout_matchingpath(common, cc, parent);
    break;

    case OP_ASSERT:
    case OP_ASSERT_NOT:
    case OP_ASSERTBACK:
    case OP_ASSERTBACK_NOT:
    PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
    cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
    break;

    case OP_BRAMINZERO:
    PUSH_BACKTRACK_NOVALUE(sizeof(braminzero_backtrack), cc);
    cc = bracketend(cc + 1);
    if (*(cc - 1 - LINK_SIZE) != OP_KETRMIN)
      {
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      }
    else
      {
      allocate_stack(common, 2);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), STR_PTR, 0);
      }
    BACKTRACK_AS(braminzero_backtrack)->matchingpath = LABEL();
    count_match(common);
    break;

    case OP_ONCE:
    case OP_BRA:
    case OP_CBRA:
    case OP_COND:
    case OP_SBRA:
    case OP_SCBRA:
    case OP_SCOND:
    cc = compile_bracket_matchingpath(common, cc, parent);
    break;

    case OP_BRAZERO:
    if (cc[1] > OP_ASSERTBACK_NOT)
      cc = compile_bracket_matchingpath(common, cc, parent);
    else
      {
      PUSH_BACKTRACK_NOVALUE(sizeof(assert_backtrack), cc);
      cc = compile_assert_matchingpath(common, cc, BACKTRACK_AS(assert_backtrack), FALSE);
      }
    break;

    case OP_BRAPOS:
    case OP_CBRAPOS:
    case OP_SBRAPOS:
    case OP_SCBRAPOS:
    case OP_BRAPOSZERO:
    cc = compile_bracketpos_matchingpath(common, cc, parent);
    break;

    case OP_MARK:
    PUSH_BACKTRACK_NOVALUE(sizeof(backtrack_common), cc);
    SLJIT_ASSERT(common->mark_ptr != 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), common->mark_ptr);
    allocate_stack(common, common->has_skip_arg ? 5 : 1);
    OP1(SLJIT_MOV, TMP1, 0, ARGUMENTS, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(common->has_skip_arg ? 4 : 0), TMP2, 0);
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_IMM, (sljit_sw)(cc + 2));
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->mark_ptr, TMP2, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(TMP1), SLJIT_OFFSETOF(jit_arguments, mark_ptr), TMP2, 0);
    if (common->has_skip_arg)
      {
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->control_head_ptr, STACK_TOP, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, type_mark);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), SLJIT_IMM, (sljit_sw)(cc + 2));
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(3), STR_PTR, 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), TMP1, 0);
      }
    cc += 1 + 2 + cc[1];
    break;

    case OP_PRUNE:
    case OP_PRUNE_ARG:
    case OP_SKIP:
    case OP_SKIP_ARG:
    case OP_THEN:
    case OP_THEN_ARG:
    case OP_COMMIT:
    case OP_COMMIT_ARG:
    cc = compile_control_verb_matchingpath(common, cc, parent);
    break;

    case OP_FAIL:
    case OP_ACCEPT:
    case OP_ASSERT_ACCEPT:
    cc = compile_fail_accept_matchingpath(common, cc, parent);
    break;

    case OP_CLOSE:
    cc = compile_close_matchingpath(common, cc);
    break;

    case OP_SKIPZERO:
    cc = bracketend(cc + 1);
    break;

    default:
    SLJIT_UNREACHABLE();
    return;
    }
  if (cc == NULL)
    return;
  }

if (has_then_trap)
  {
  /* Head item on backtrack. */
  PUSH_BACKTRACK_NOVALUE(sizeof(then_trap_backtrack), cc);
  BACKTRACK_AS(then_trap_backtrack)->common.cc = then_trap_opcode;
  BACKTRACK_AS(then_trap_backtrack)->then_trap = common->then_trap;
  common->then_trap = save_then_trap;
  }
SLJIT_ASSERT(cc == ccend);
}